

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O2

void __thiscall cmCTestCVS::LogParser::FinishRevision(LogParser *this)

{
  Revision *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  ostream *poVar1;
  Revision local_120;
  
  __x = &this->Rev;
  if ((this->Rev).Rev._M_string_length != 0) {
    poVar1 = std::operator<<((this->CVS->super_cmCTestVC).Log,"Found revision ");
    poVar1 = std::operator<<(poVar1,(string *)__x);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"  author = ");
    poVar1 = std::operator<<(poVar1,(string *)&(this->Rev).Author);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"  date = ");
    poVar1 = std::operator<<(poVar1,(string *)&(this->Rev).Date);
    std::operator<<(poVar1,"\n");
    std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
              (this->Revisions,__x);
    if (0x100 < (ulong)((long)(this->Revisions->
                              super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->Revisions->
                             super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>
                             )._M_impl.super__Vector_impl_data._M_start)) {
      this->Section = SectionEnd;
    }
  }
  __s = &local_120.Rev.field_2;
  memset(__s,0,0xf0);
  local_120.Rev._M_string_length = 0;
  local_120.Date._M_dataplus._M_p = (pointer)&local_120.Date.field_2;
  local_120.Date.field_2._M_local_buf[0] = '\0';
  local_120.Author._M_dataplus._M_p = (pointer)&local_120.Author.field_2;
  local_120.Author.field_2._M_local_buf[0] = '\0';
  local_120.EMail._M_dataplus._M_p = (pointer)&local_120.EMail.field_2;
  local_120.EMail.field_2._M_local_buf[0] = '\0';
  local_120.Committer._M_dataplus._M_p = (pointer)&local_120.Committer.field_2;
  local_120.Committer.field_2._M_local_buf[0] = '\0';
  local_120.CommitterEMail._M_dataplus._M_p = (pointer)&local_120.CommitterEMail.field_2;
  local_120.CommitterEMail.field_2._M_local_buf[0] = '\0';
  local_120.CommitDate._M_dataplus._M_p = (pointer)&local_120.CommitDate.field_2;
  local_120.CommitDate.field_2._M_local_buf[0] = '\0';
  local_120.Log._M_dataplus._M_p = (pointer)&local_120.Log.field_2;
  local_120.Log.field_2._M_local_buf[0] = '\0';
  local_120.Rev._M_dataplus._M_p = (pointer)__s;
  cmCTestVC::Revision::operator=(__x,&local_120);
  cmCTestVC::Revision::~Revision(&local_120);
  return;
}

Assistant:

void FinishRevision()
  {
    if (!this->Rev.Rev.empty()) {
      // Record this revision.
      /* clang-format off */
      this->CVS->Log << "Found revision " << this->Rev.Rev << "\n"
                     << "  author = " << this->Rev.Author << "\n"
                     << "  date = " << this->Rev.Date << "\n";
      /* clang-format on */
      this->Revisions.push_back(this->Rev);

      // We only need two revisions.
      if (this->Revisions.size() >= 2) {
        this->Section = SectionEnd;
      }
    }
    this->Rev = Revision();
  }